

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O1

void __thiscall SkeletalMesh::Scene::clear(Scene *this)

{
  pointer pMVar1;
  pointer pMVar2;
  pointer pBVar3;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  this->available = false;
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  std::__cxx11::string::operator=((string *)&this->filename,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  this->scene = (aiScene *)0x0;
  (*__glewDeleteVertexArrays)(1,&this->vao);
  this->vao = 0;
  (*__glewDeleteBuffers)(1,&this->vbo);
  this->vbo = 0;
  (*__glewDeleteBuffers)(1,&this->ebo);
  this->ebo = 0;
  pMVar1 = (this->meshEntry).
           super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->meshEntry).
      super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar1) {
    (this->meshEntry).
    super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar1;
  }
  pMVar2 = (this->material).
           super__Vector_base<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->material).
      super__Vector_base<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar2) {
    (this->material).
    super__Vector_base<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar2;
  }
  pBVar3 = (this->skeleton).
           super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->skeleton).super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>.
      _M_impl.super__Vector_impl_data._M_finish != pBVar3) {
    (this->skeleton).super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>.
    _M_impl.super__Vector_impl_data._M_finish = pBVar3;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::clear(&(this->nameBoneMap)._M_t);
  return;
}

Assistant:

void clear() {
            available = false;
            name = std::string();
            filename = std::string();
            // importer..
            scene = NULL;
            glDeleteVertexArrays(1, &vao);
            vao = 0;
            glDeleteBuffers(1, &vbo);
            vbo = 0;
            glDeleteBuffers(1, &ebo);
            ebo = 0;
            meshEntry.clear();
            material.clear();
            skeleton.clear();
            nameBoneMap.clear();
        }